

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

void __thiscall pstore::uuid::uuid(uuid *this,string *str)

{
  bool bVar1;
  uuid *this_00;
  container_type *pcVar2;
  undefined1 local_29 [8];
  maybe<pstore::uuid,_void> d;
  string *str_local;
  uuid *this_local;
  
  d.storage_._8_8_ = str;
  memset(this,0,0x10);
  from_string((maybe<pstore::uuid,_void> *)local_29,(string *)d.storage_._8_8_);
  bVar1 = maybe<pstore::uuid,_void>::has_value((maybe<pstore::uuid,_void> *)local_29);
  if (!bVar1) {
    raise<pstore::error_code>(uuid_parse_error);
  }
  this_00 = maybe<pstore::uuid,_void>::operator->((maybe<pstore::uuid,_void> *)local_29);
  pcVar2 = array(this_00);
  *(undefined8 *)(this->data_)._M_elems = *(undefined8 *)pcVar2->_M_elems;
  *(undefined8 *)((this->data_)._M_elems + 8) = *(undefined8 *)(pcVar2->_M_elems + 8);
  maybe<pstore::uuid,_void>::~maybe((maybe<pstore::uuid,_void> *)local_29);
  return;
}

Assistant:

uuid::uuid (std::string const & str) {
        maybe<uuid> d = uuid::from_string (str);
        if (!d.has_value ()) {
            raise (pstore::error_code::uuid_parse_error);
        }
        data_ = d->array ();
    }